

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::writeNode(OpenDDLExport *this,DDLNode *node,string *statement)

{
  bool bVar1;
  DataArrayList *al_00;
  Value *val;
  Value *v;
  DataArrayList *al;
  string *statement_local;
  DDLNode *node_local;
  OpenDDLExport *this_local;
  
  writeNodeHeader(this,node,statement);
  bVar1 = DDLNode::hasProperties(node);
  if (bVar1) {
    writeProperties(this,node,statement);
  }
  writeLineEnd(statement);
  std::__cxx11::string::operator=((string *)statement,"}");
  al_00 = DDLNode::getDataArrayList(node);
  if (al_00 != (DataArrayList *)0x0) {
    writeValueType(this,al_00->m_dataList->m_type,al_00->m_numItems,statement);
    writeValueArray(this,al_00,statement);
  }
  val = DDLNode::getValue(node);
  if (val != (Value *)0x0) {
    writeValueType(this,val->m_type,1,statement);
    std::__cxx11::string::operator=((string *)statement,"{");
    writeLineEnd(statement);
    writeValue(this,val,statement);
    std::__cxx11::string::operator=((string *)statement,"}");
    writeLineEnd(statement);
  }
  std::__cxx11::string::operator=((string *)statement,"}");
  writeLineEnd(statement);
  writeToStream(this,statement);
  return true;
}

Assistant:

bool OpenDDLExport::writeNode( DDLNode *node, std::string &statement ) {
    writeNodeHeader( node, statement );
    if (node->hasProperties()) {
        writeProperties( node, statement );
    }
    writeLineEnd( statement );

    statement = "}";
    DataArrayList *al( node->getDataArrayList() );
    if ( ddl_nullptr != al ) {
        writeValueType( al->m_dataList->m_type, al->m_numItems, statement );
        writeValueArray( al, statement );
    }
    Value *v( node->getValue() );
    if (ddl_nullptr != v ) {
        writeValueType( v->m_type, 1, statement );
        statement = "{";
        writeLineEnd( statement );
        writeValue( v, statement );
        statement = "}";
        writeLineEnd( statement );
    }
    statement = "}";
    writeLineEnd( statement );

    writeToStream( statement );

    return true;
}